

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

void __thiscall ONX_ModelPrivate::ONX_ModelPrivate(ONX_ModelPrivate *this,ONX_Model *m)

{
  Type TVar1;
  int iVar2;
  ONX_ModelComponentList *pOVar3;
  ONX_ModelComponentList *list;
  uint i;
  ONX_Model *m_local;
  ONX_ModelPrivate *this_local;
  
  this->m_model = m;
  this->m_model_content_version_number = 0;
  ON_ClassArray<ONX_Model::ONX_ModelComponentList>::ON_ClassArray(&this->m_mcr_lists);
  iVar2 = ON_ComponentManifestImpl_TableCount();
  ON_REMOVE_ASAP_AssertEx
            ((uint)(iVar2 == 0x12),
             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,0x131f,"",
             "int(ON_ModelComponent::Type::NumOf) == ON_ComponentManifestImpl_TableCount() is false"
            );
  for (list._0_4_ = 0; (uint)list < 0x12; list._0_4_ = (uint)list + 1) {
    pOVar3 = ON_ClassArray<ONX_Model::ONX_ModelComponentList>::AppendNew(&this->m_mcr_lists);
    TVar1 = ON_ModelComponent::ComponentTypeFromUnsigned((uint)list);
    pOVar3->m_component_type = TVar1;
  }
  return;
}

Assistant:

ONX_ModelPrivate::ONX_ModelPrivate(ONX_Model& m)
  :
  m_model(m)
{
  // The TableCount enum in opennurbs_archive_manifest.cpp should always be
  // equal to ON_ModelComponent::Type::NumOf.
  ON_ASSERT(int(ON_ModelComponent::Type::NumOf) == ON_ComponentManifestImpl_TableCount());

  for (unsigned int i = 0; i < int(ON_ModelComponent::Type::NumOf); i++)
  {
    ONX_Model::ONX_ModelComponentList& list = m_mcr_lists.AppendNew();
    list.m_component_type = ON_ModelComponent::ComponentTypeFromUnsigned(i);
  }
}